

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::ContainsOperator,bool,false,true>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  ulong uVar2;
  undefined8 uVar3;
  char *pcVar4;
  idx_t iVar5;
  unsigned_long *puVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  char **ppcVar13;
  ulong uVar14;
  char **local_88;
  anon_union_16_2_67f50693_for_value local_80;
  string_t *local_70;
  bool *local_68;
  ulong local_60;
  unsigned_long *local_58;
  anon_union_16_2_67f50693_for_value local_50;
  ulong local_40;
  bool *local_38;
  
  puVar6 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_70 = rdata;
  local_68 = result_data;
  if (puVar6 == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar3 = *(undefined8 *)&rdata->value;
      pcVar4 = (rdata->value).pointer.ptr;
      local_88 = &(ldata->value).pointer.ptr;
      iVar5 = 0;
      do {
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(local_88 + -1);
        local_50._0_4_ = paVar1->length;
        local_50._4_1_ = paVar1->prefix[0];
        local_50._5_1_ = paVar1->prefix[1];
        local_50._6_1_ = paVar1->prefix[2];
        local_50._7_1_ = paVar1->prefix[3];
        local_50.pointer.ptr = *local_88;
        local_80._0_8_ = uVar3;
        local_80.pointer.ptr = pcVar4;
        iVar7 = FindStrInStr((string_t *)&local_50.pointer,(string_t *)&local_80.pointer);
        local_68[iVar5] = iVar7 != 0xffffffffffffffff;
        iVar5 = iVar5 + 1;
        local_88 = local_88 + 2;
      } while (count != iVar5);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar11 = count + 0x3f >> 6;
    uVar8 = 0;
    uVar12 = 0;
    local_60 = uVar11;
    local_58 = puVar6;
    local_40 = count;
    do {
      uVar2 = puVar6[uVar8];
      uVar9 = uVar12 + 0x40;
      if (local_40 <= uVar12 + 0x40) {
        uVar9 = local_40;
      }
      uVar10 = uVar9;
      if (uVar2 != 0) {
        uVar10 = uVar12;
        if (uVar2 == 0xffffffffffffffff) {
          if (uVar12 < uVar9) {
            uVar3 = *(undefined8 *)&local_70->value;
            pcVar4 = (local_70->value).pointer.ptr;
            ppcVar13 = &ldata[uVar12].value.pointer.ptr;
            do {
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar13 + -1);
              local_50._0_4_ = paVar1->length;
              local_50._4_1_ = paVar1->prefix[0];
              local_50._5_1_ = paVar1->prefix[1];
              local_50._6_1_ = paVar1->prefix[2];
              local_50._7_1_ = paVar1->prefix[3];
              local_50.pointer.ptr = *ppcVar13;
              local_80._0_8_ = uVar3;
              local_80.pointer.ptr = pcVar4;
              iVar5 = FindStrInStr((string_t *)&local_50.pointer,(string_t *)&local_80.pointer);
              local_68[uVar12] = iVar5 != 0xffffffffffffffff;
              uVar12 = uVar12 + 1;
              ppcVar13 = ppcVar13 + 2;
              puVar6 = local_58;
              result_data = local_68;
              uVar10 = uVar9;
              uVar11 = local_60;
            } while (uVar9 != uVar12);
          }
        }
        else if (uVar12 < uVar9) {
          local_38 = result_data + uVar12;
          ppcVar13 = &ldata[uVar12].value.pointer.ptr;
          uVar14 = 0;
          do {
            if ((uVar2 >> (uVar14 & 0x3f) & 1) != 0) {
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar13 + -1);
              local_50._0_4_ = paVar1->length;
              local_50._4_1_ = paVar1->prefix[0];
              local_50._5_1_ = paVar1->prefix[1];
              local_50._6_1_ = paVar1->prefix[2];
              local_50._7_1_ = paVar1->prefix[3];
              local_50.pointer.ptr = *ppcVar13;
              local_80._0_8_ = *(undefined8 *)&local_70->value;
              local_80.pointer.ptr = (local_70->value).pointer.ptr;
              iVar5 = FindStrInStr((string_t *)&local_50.pointer,(string_t *)&local_80.pointer);
              local_38[uVar14] = iVar5 != 0xffffffffffffffff;
              result_data = local_68;
            }
            uVar14 = uVar14 + 1;
            ppcVar13 = ppcVar13 + 2;
            puVar6 = local_58;
            uVar10 = uVar9;
            uVar11 = local_60;
          } while (uVar9 - uVar12 != uVar14);
        }
      }
      uVar8 = uVar8 + 1;
      uVar12 = uVar10;
    } while (uVar8 != uVar11);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}